

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Quantize_x86_avx512::forward
          (Quantize_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint elempack;
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  uint uVar4;
  undefined1 (*pauVar5) [64];
  Mat *pMVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  int *piVar10;
  char *pcVar11;
  int q_1;
  uint uVar12;
  uint _elempack;
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [64];
  float *pfVar16;
  Allocator *pAVar17;
  ncnn *pnVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  int iVar22;
  long lVar23;
  char *pcVar24;
  byte bVar25;
  int q;
  ulong uVar26;
  int _w;
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  
  elempack = bottom_blob->elempack;
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  uVar4 = bottom_blob->h;
  uVar8 = (ulong)uVar4;
  lVar13 = (long)(int)elempack;
  if (iVar1 == 3) {
    uVar12 = bottom_blob->c;
    uVar8 = (ulong)uVar12;
    bVar25 = (elempack * uVar12 & 7) == 0 & opt->use_packing_layout;
    sVar7 = 1;
    if (bVar25 != 0) {
      sVar7 = 8;
    }
    _elempack = (uint)sVar7;
    Mat::create(top_blob,_w,uVar4,(int)(elempack * uVar12) / (int)_elempack,sVar7,_elempack,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (((0 < (int)uVar12 && elempack == 0x10) & bVar25) == 1) {
      lVar23 = 1;
      auVar28 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
      auVar29 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      lVar14 = 0;
      auVar33 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,CONCAT111(0x81,
                                                  CONCAT110(0x81,CONCAT19(0x81,CONCAT18(0x81,
                                                  0x8181818181818181)))))))));
      uVar26 = 0;
      do {
        pvVar2 = top_blob->data;
        sVar7 = top_blob->elemsize;
        sVar3 = top_blob->cstep;
        pauVar5 = (undefined1 (*) [64])
                  (bottom_blob->cstep * uVar26 * bottom_blob->elemsize + (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          pauVar15 = (undefined1 (*) [64])(this->super_Quantize).scale_data.data;
          piVar10 = (this->super_Quantize).scale_data.refcount;
          pAVar17 = (this->super_Quantize).scale_data.allocator;
          iVar1 = (this->super_Quantize).scale_data.w;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + 1;
            UNLOCK();
          }
          if (1 < iVar1) goto LAB_00440013;
          auVar30 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar15));
        }
        else {
          pauVar15 = (undefined1 (*) [64])
                     ((this->super_Quantize).scale_data.elemsize * uVar26 * 0x10 +
                     (long)(this->super_Quantize).scale_data.data);
          pAVar17 = (this->super_Quantize).scale_data.allocator;
          piVar10 = (int *)0x0;
LAB_00440013:
          auVar30 = *pauVar15;
        }
        if (0 < (int)(uVar4 * _w)) {
          lVar19 = sVar3 * sVar7;
          lVar20 = 0;
          do {
            auVar31 = vmulps_avx512f(auVar30,*pauVar5);
            auVar32 = vmovdqa64_avx512f(auVar28);
            auVar32 = vpternlogd_avx512f(auVar32,auVar31,auVar29,0xf8);
            auVar31 = vaddps_avx512f(auVar31,auVar32);
            auVar31 = vcvttps2dq_avx512f(auVar31);
            auVar27 = vpmovsdb_avx512f(auVar31);
            auVar27 = vpmaxsb_avx(auVar27,auVar33._0_16_);
            *(long *)((long)pvVar2 + lVar20 * 8 + lVar19 * lVar14) = auVar27._0_8_;
            auVar27 = vpshufd_avx(auVar27,0x4e);
            *(long *)((long)pvVar2 + lVar20 * 8 + lVar19 * lVar23) = auVar27._0_8_;
            pauVar5 = pauVar5 + 1;
            lVar20 = lVar20 + 1;
          } while (uVar4 * _w != (int)lVar20);
        }
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (pAVar17 == (Allocator *)0x0) {
              free(pauVar15);
              auVar28 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
              auVar29 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
              auVar33 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,
                                                  CONCAT111(0x81,CONCAT110(0x81,CONCAT19(0x81,
                                                  CONCAT18(0x81,0x8181818181818181)))))))));
            }
            else {
              (*pAVar17->_vptr_Allocator[3])();
              auVar28 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
              auVar29 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
              auVar33 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,
                                                  CONCAT111(0x81,CONCAT110(0x81,CONCAT19(0x81,
                                                  CONCAT18(0x81,0x8181818181818181)))))))));
            }
          }
        }
        uVar26 = uVar26 + 1;
        lVar14 = lVar14 + 2;
        lVar23 = lVar23 + 2;
      } while (uVar26 != uVar8);
    }
    if (0 < (int)uVar12 && (elempack == 4 && bVar25 == 0)) {
      lVar14 = 3;
      uVar26 = 0;
      do {
        sVar7 = top_blob->cstep;
        pvVar2 = top_blob->data;
        sVar3 = top_blob->elemsize;
        pfVar16 = (float *)(sVar7 * (lVar14 + -3) * sVar3 + (long)pvVar2);
        pcVar11 = (char *)((lVar14 + -2) * sVar7 * sVar3 + (long)pvVar2);
        pcVar9 = (char *)((lVar14 + -1) * sVar7 * sVar3 + (long)pvVar2);
        pcVar21 = (char *)(sVar7 * lVar14 * sVar3 + (long)pvVar2);
        pcVar24 = (char *)(this->super_Quantize).scale_data.data;
        pnVar18 = (ncnn *)(bottom_blob->cstep * uVar26 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar10 = (this->super_Quantize).scale_data.refcount;
          pMVar6 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
          if (piVar10 == (int *)0x0) goto LAB_00440451;
          pAVar17 = (this->super_Quantize).scale_data.allocator;
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
          quantize_pack4to1(pnVar18,pfVar16,pcVar11,pcVar9,pcVar21,pcVar24,pMVar6,uVar4 * _w);
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (pAVar17 == (Allocator *)0x0) {
              if (pcVar24 != (char *)0x0) {
                free(pcVar24);
              }
            }
            else {
              (*pAVar17->_vptr_Allocator[3])(pAVar17,pcVar24);
            }
          }
        }
        else {
          pcVar24 = pcVar24 + (lVar14 + -3) * (this->super_Quantize).scale_data.elemsize;
          pMVar6 = (Mat *)&DAT_00000004;
LAB_00440451:
          quantize_pack4to1(pnVar18,pfVar16,pcVar11,pcVar9,pcVar21,pcVar24,pMVar6,uVar4 * _w);
        }
        uVar26 = uVar26 + 1;
        lVar14 = lVar14 + 4;
      } while (uVar8 != uVar26);
    }
    if (elempack != _elempack || (int)uVar12 < 1) {
      return 0;
    }
    lVar14 = 0;
    uVar26 = 0;
    do {
      pnVar18 = (ncnn *)(bottom_blob->cstep * uVar26 * bottom_blob->elemsize +
                        (long)bottom_blob->data);
      pfVar16 = (float *)(top_blob->cstep * uVar26 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Quantize).scale_data_size < 2) {
        pcVar24 = (char *)(this->super_Quantize).scale_data.data;
        piVar10 = (this->super_Quantize).scale_data.refcount;
        pMVar6 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
        if (piVar10 == (int *)0x0) goto LAB_0044020b;
        pAVar17 = (this->super_Quantize).scale_data.allocator;
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
        quantize(pnVar18,pfVar16,pcVar24,pMVar6,uVar4 * _w,elempack);
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (pAVar17 == (Allocator *)0x0) {
            if (pcVar24 != (char *)0x0) {
              free(pcVar24);
            }
          }
          else {
            (*pAVar17->_vptr_Allocator[3])(pAVar17,pcVar24);
          }
        }
      }
      else {
        pcVar24 = (char *)((this->super_Quantize).scale_data.elemsize * lVar14 +
                          (long)(this->super_Quantize).scale_data.data);
        pMVar6 = (Mat *)(ulong)elempack;
LAB_0044020b:
        quantize(pnVar18,pfVar16,pcVar24,pMVar6,uVar4 * _w,elempack);
      }
      uVar26 = uVar26 + 1;
      lVar14 = lVar14 + lVar13;
    } while (uVar8 != uVar26);
  }
  else if (iVar1 == 2) {
    bVar25 = (elempack * uVar4 & 7) == 0 & opt->use_packing_layout;
    sVar7 = 1;
    if (bVar25 != 0) {
      sVar7 = 8;
    }
    uVar12 = (uint)sVar7;
    Mat::create(top_blob,_w,(int)(elempack * uVar4) / (int)uVar12,sVar7,uVar12,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (((0 < (int)uVar4 && elempack == 0x10) & bVar25) == 1) {
      lVar23 = 1;
      auVar28 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
      auVar29 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      lVar14 = 0;
      auVar33 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,CONCAT111(0x81,
                                                  CONCAT110(0x81,CONCAT19(0x81,CONCAT18(0x81,
                                                  0x8181818181818181)))))))));
      uVar26 = 0;
      do {
        pvVar2 = top_blob->data;
        sVar7 = top_blob->elemsize;
        iVar1 = top_blob->w;
        pauVar5 = (undefined1 (*) [64])
                  ((long)bottom_blob->w * uVar26 * bottom_blob->elemsize + (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          pauVar15 = (undefined1 (*) [64])(this->super_Quantize).scale_data.data;
          piVar10 = (this->super_Quantize).scale_data.refcount;
          pAVar17 = (this->super_Quantize).scale_data.allocator;
          iVar22 = (this->super_Quantize).scale_data.w;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + 1;
            UNLOCK();
          }
          if (1 < iVar22) goto LAB_0043fca6;
          auVar30 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar15));
        }
        else {
          pauVar15 = (undefined1 (*) [64])
                     ((this->super_Quantize).scale_data.elemsize * uVar26 * 0x10 +
                     (long)(this->super_Quantize).scale_data.data);
          pAVar17 = (this->super_Quantize).scale_data.allocator;
          piVar10 = (int *)0x0;
LAB_0043fca6:
          auVar30 = *pauVar15;
        }
        if (0 < _w) {
          lVar19 = 0;
          do {
            auVar31 = vmulps_avx512f(auVar30,*pauVar5);
            auVar32 = vmovdqa64_avx512f(auVar28);
            auVar32 = vpternlogd_avx512f(auVar32,auVar31,auVar29,0xf8);
            auVar31 = vaddps_avx512f(auVar31,auVar32);
            auVar31 = vcvttps2dq_avx512f(auVar31);
            auVar27 = vpmovsdb_avx512f(auVar31);
            auVar27 = vpmaxsb_avx(auVar27,auVar33._0_16_);
            *(long *)((long)pvVar2 + lVar19 * 8 + sVar7 * lVar14 * (long)iVar1) = auVar27._0_8_;
            auVar27 = vpshufd_avx(auVar27,0x4e);
            *(long *)((long)pvVar2 + lVar19 * 8 + sVar7 * lVar23 * (long)iVar1) = auVar27._0_8_;
            pauVar5 = pauVar5 + 1;
            lVar19 = lVar19 + 1;
          } while (_w != (int)lVar19);
        }
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (pAVar17 == (Allocator *)0x0) {
              free(pauVar15);
              auVar28 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
              auVar29 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
              auVar33 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,
                                                  CONCAT111(0x81,CONCAT110(0x81,CONCAT19(0x81,
                                                  CONCAT18(0x81,0x8181818181818181)))))))));
            }
            else {
              (*pAVar17->_vptr_Allocator[3])();
              auVar28 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
              auVar29 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
              auVar33 = ZEXT1664(CONCAT115(0x81,CONCAT114(0x81,CONCAT113(0x81,CONCAT112(0x81,
                                                  CONCAT111(0x81,CONCAT110(0x81,CONCAT19(0x81,
                                                  CONCAT18(0x81,0x8181818181818181)))))))));
            }
          }
        }
        uVar26 = uVar26 + 1;
        lVar14 = lVar14 + 2;
        lVar23 = lVar23 + 2;
      } while (uVar26 != uVar8);
    }
    if (0 < (int)uVar4 && (elempack == 4 && bVar25 == 0)) {
      lVar14 = 3;
      uVar26 = 0;
      do {
        pvVar2 = top_blob->data;
        lVar23 = (long)top_blob->w * top_blob->elemsize;
        pfVar16 = (float *)(lVar23 * (lVar14 + -3) + (long)pvVar2);
        pcVar11 = (char *)((lVar14 + -2) * lVar23 + (long)pvVar2);
        pcVar9 = (char *)((lVar14 + -1) * lVar23 + (long)pvVar2);
        pcVar21 = (char *)(lVar23 * lVar14 + (long)pvVar2);
        pcVar24 = (char *)(this->super_Quantize).scale_data.data;
        pnVar18 = (ncnn *)((long)bottom_blob->w * uVar26 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar10 = (this->super_Quantize).scale_data.refcount;
          pMVar6 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
          if (piVar10 == (int *)0x0) goto LAB_00440328;
          pAVar17 = (this->super_Quantize).scale_data.allocator;
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
          quantize_pack4to1(pnVar18,pfVar16,pcVar11,pcVar9,pcVar21,pcVar24,pMVar6,_w);
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (pAVar17 == (Allocator *)0x0) {
              if (pcVar24 != (char *)0x0) {
                free(pcVar24);
              }
            }
            else {
              (*pAVar17->_vptr_Allocator[3])(pAVar17,pcVar24);
            }
          }
        }
        else {
          pcVar24 = pcVar24 + (lVar14 + -3) * (this->super_Quantize).scale_data.elemsize;
          pMVar6 = (Mat *)&DAT_00000004;
LAB_00440328:
          quantize_pack4to1(pnVar18,pfVar16,pcVar11,pcVar9,pcVar21,pcVar24,pMVar6,_w);
        }
        uVar26 = uVar26 + 1;
        lVar14 = lVar14 + 4;
      } while (uVar8 != uVar26);
    }
    if (elempack != uVar12 || (int)uVar4 < 1) {
      return 0;
    }
    lVar14 = 0;
    uVar26 = 0;
    do {
      pnVar18 = (ncnn *)((long)bottom_blob->w * uVar26 * bottom_blob->elemsize +
                        (long)bottom_blob->data);
      pfVar16 = (float *)((long)top_blob->w * uVar26 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Quantize).scale_data_size < 2) {
        pcVar24 = (char *)(this->super_Quantize).scale_data.data;
        piVar10 = (this->super_Quantize).scale_data.refcount;
        pMVar6 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
        if (piVar10 == (int *)0x0) goto LAB_0043fe97;
        pAVar17 = (this->super_Quantize).scale_data.allocator;
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
        quantize(pnVar18,pfVar16,pcVar24,pMVar6,_w,elempack);
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (pAVar17 == (Allocator *)0x0) {
            if (pcVar24 != (char *)0x0) {
              free(pcVar24);
            }
          }
          else {
            (*pAVar17->_vptr_Allocator[3])(pAVar17,pcVar24);
          }
        }
      }
      else {
        pcVar24 = (char *)((this->super_Quantize).scale_data.elemsize * lVar14 +
                          (long)(this->super_Quantize).scale_data.data);
        pMVar6 = (Mat *)(ulong)elempack;
LAB_0043fe97:
        quantize(pnVar18,pfVar16,pcVar24,pMVar6,_w,elempack);
      }
      uVar26 = uVar26 + 1;
      lVar14 = lVar14 + lVar13;
    } while (uVar8 != uVar26);
  }
  else {
    if (iVar1 != 1) {
      return 0;
    }
    sVar7 = 8;
    if (opt->use_packing_layout == false) {
      sVar7 = 1;
    }
    if ((elempack * _w & 7) != 0) {
      sVar7 = 1;
    }
    Mat::create(top_blob,(int)(elempack * _w) / (int)sVar7,sVar7,(int)sVar7,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar4 = _w / opt->num_threads;
    uVar8 = 1;
    if (1 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    iVar1 = (int)uVar8;
    uVar26 = (long)(_w + iVar1 + -1) / (long)iVar1;
    if ((int)uVar26 < 1) {
      return 0;
    }
    uVar26 = uVar26 & 0xffffffff;
    lVar23 = 0;
    lVar14 = 0;
    do {
      iVar22 = _w;
      if (iVar1 < _w) {
        iVar22 = iVar1;
      }
      _w = -(iVar1 - _w);
      quantize((ncnn *)((long)bottom_blob->data + lVar14),(float *)((long)top_blob->data + lVar23),
               (char *)(this->super_Quantize).scale_data.data,
               (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w,iVar22 * elempack,1);
      lVar14 = lVar14 + lVar13 * uVar8 * 4;
      lVar23 = lVar23 + lVar13 * uVar8;
      uVar26 = uVar26 - 1;
    } while (uVar26 != 0);
  }
  return 0;
}

Assistant:

int Quantize_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}